

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_diff.hpp
# Opt level: O2

void __thiscall
MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
MyersDiff(MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *original_text,
         basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *changed_text)

{
  ConstIter CVar1;
  ConstIter CVar2;
  Range text1;
  Range text2;
  _Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  _Stack_28;
  
  this->Diff_Timeout = 1000;
  this->Diff_EditCost = 4;
  this->Match_Threshold = 0.5;
  this->Match_Distance = 1000;
  this->Patch_DeleteThreshold = 0.5;
  this->Patch_Margin = 4;
  this->text1 = original_text;
  this->text2 = changed_text;
  (this->result).
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->result).
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result).
  super__Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CVar1._M_current = (original_text->_M_dataplus)._M_p;
  text1.till._M_current = CVar1._M_current + original_text->_M_string_length;
  CVar2._M_current = (changed_text->_M_dataplus)._M_p;
  text2.till._M_current = CVar2._M_current + changed_text->_M_string_length;
  text1.from._M_current = CVar1._M_current;
  text2.from._M_current = CVar2._M_current;
  diff_main((Diffs *)&_Stack_28,this,text1,text2);
  std::
  vector<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::_M_move_assign(&this->result,&_Stack_28);
  std::
  _Vector_base<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff,_std::allocator<MyersDiff<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Diff>_>
  ::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

MyersDiff(const String& original_text, const String& changed_text)
        : text1{original_text}, text2{changed_text} {
        result = diff_main(Range{text1}, Range{text2});
    }